

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalSubtyping.cpp
# Opt level: O3

void __thiscall
wasm::LocalSubtyping::doWalkFunction(wasm::Function*)::Scanner::visitLocalGet(wasm::LocalGet__
          (void *this,LocalGet *curr)

{
  vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>> *this_00;
  uint uVar1;
  iterator __position;
  LocalGet *local_10;
  LocalGet *curr_local;
  
  uVar1 = curr->index;
  if ((*(ulong *)(*(long *)((long)this + 0xd8) + (ulong)(uVar1 >> 6) * 8) >> ((ulong)uVar1 & 0x3f) &
      1) != 0) {
    this_00 = (vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>> *)
              (*(long *)((long)this + 0x118) + (ulong)uVar1 * 0x18);
    __position._M_current = *(LocalGet ***)(this_00 + 8);
    if (__position._M_current == *(LocalGet ***)(this_00 + 0x10)) {
      local_10 = curr;
      std::vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>>::
      _M_realloc_insert<wasm::LocalGet*const&>(this_00,__position,&local_10);
    }
    else {
      *__position._M_current = curr;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
        if (relevant[curr->index]) {
          getsForLocal[curr->index].push_back(curr);
        }
      }